

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::previous_sibling(xml_node *this,char_t *name_)

{
  bool bVar1;
  xml_node_struct *in_RAX;
  xml_node_struct *p;
  xml_node local_18;
  
  p = this->_root;
  local_18._root = in_RAX;
  if (p == (xml_node_struct *)0x0) {
LAB_00688dee:
    xml_node(&local_18);
  }
  else {
    do {
      p = p->prev_sibling_c;
      if (p->next_sibling == (xml_node_struct *)0x0) goto LAB_00688dee;
    } while ((p->name == (char_t *)0x0) ||
            (bVar1 = impl::anon_unknown_0::strequal(name_,p->name), !bVar1));
    xml_node(&local_18,p);
  }
  return (xml_node)local_18._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::previous_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->prev_sibling_c; i->next_sibling; i = i->prev_sibling_c)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}